

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

int matchshreg(match *res,reg *reg,easm_expr *expr,int shl,iasctx *ctx)

{
  int iVar1;
  ull sh;
  easm_expr **ppeVar2;
  ulong uVar3;
  
  sh = 0;
  do {
    if (expr->type == EASM_EXPR_MUL) {
      if (expr->e2->type == EASM_EXPR_NUM) {
        uVar3 = expr->e2->num;
        if ((uVar3 ^ uVar3 - 1) <= uVar3 - 1) {
          return 0;
        }
        for (; uVar3 != 1; uVar3 = uVar3 >> 1) {
          sh = sh + 1;
        }
        goto LAB_0024768a;
      }
      if (expr->e1->type != EASM_EXPR_NUM) {
LAB_002476c2:
        if (sh != (long)shl) {
          return 0;
        }
        iVar1 = matchreg(res,reg,expr,ctx);
        return iVar1;
      }
      uVar3 = expr->e1->num;
      if ((uVar3 ^ uVar3 - 1) <= uVar3 - 1) {
        return 0;
      }
      ppeVar2 = &expr->e2;
      for (; uVar3 != 1; uVar3 = uVar3 >> 1) {
        sh = sh + 1;
      }
    }
    else {
      if ((expr->type != EASM_EXPR_SHL) || (expr->e2->type != EASM_EXPR_NUM)) goto LAB_002476c2;
      sh = sh + expr->e2->num;
LAB_0024768a:
      ppeVar2 = &expr->e1;
    }
    expr = *ppeVar2;
  } while( true );
}

Assistant:

int matchshreg (struct match *res, const struct reg *reg, const struct easm_expr *expr, int shl, struct iasctx *ctx) {
	ull sh = 0;
	while (1) {
		if (expr->type == EASM_EXPR_SHL && expr->e2->type == EASM_EXPR_NUM) {
			sh += expr->e2->num;
			expr = expr->e1;
		} else if (expr->type == EASM_EXPR_MUL && expr->e2->type == EASM_EXPR_NUM) {
			ull num = expr->e2->num;
			if (!num || (num & (num-1)))
				return 0;
			while (num != 1)
				num >>= 1, sh++;
			expr = expr->e1;
		} else if (expr->type == EASM_EXPR_MUL && expr->e1->type == EASM_EXPR_NUM) {
			ull num = expr->e1->num;
			if (!num || (num & (num-1)))
				return 0;
			while (num != 1)
				num >>= 1, sh++;
			expr = expr->e2;
		} else {
			break;
		}
	}
	if (sh != shl)
		return 0;
	return matchreg(res, reg, expr, ctx);
}